

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

uint __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
::int_writer<int,fmt::v5::basic_format_specs<char>>::count_digits<3u>
          (int_writer<int,fmt::v5::basic_format_specs<char>> *this)

{
  uint local_18;
  uint local_14;
  uint num_digits;
  unsigned_type n;
  int_writer<int,_fmt::v5::basic_format_specs<char>_> *this_local;
  
  local_14 = *(uint *)(this + 0x10);
  local_18 = 0;
  do {
    local_18 = local_18 + 1;
    local_14 = local_14 >> 3;
  } while (local_14 != 0);
  return local_18;
}

Assistant:

unsigned count_digits() const {
      unsigned_type n = abs_value;
      unsigned num_digits = 0;
      do {
        ++num_digits;
      } while ((n >>= BITS) != 0);
      return num_digits;
    }